

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btBroadphasePair>::push_back
          (btAlignedObjectArray<btBroadphasePair> *this,btBroadphasePair *_Val)

{
  btBroadphasePair *pbVar1;
  btBroadphaseProxy *pbVar2;
  int iVar3;
  int _Count;
  
  iVar3 = this->m_size;
  if (iVar3 == this->m_capacity) {
    _Count = 1;
    if (iVar3 != 0) {
      _Count = iVar3 * 2;
    }
    reserve(this,_Count);
    iVar3 = this->m_size;
  }
  pbVar1 = this->m_data;
  pbVar2 = _Val->m_pProxy1;
  pbVar1[iVar3].m_pProxy0 = _Val->m_pProxy0;
  pbVar1[iVar3].m_pProxy1 = pbVar2;
  pbVar1[iVar3].m_algorithm = _Val->m_algorithm;
  pbVar1[iVar3].field_3 = _Val->field_3;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}